

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O2

int isotree_serialize_to_file(void *isotree_model,FILE *output)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (isotree_model == (void *)0x0) {
    pcVar2 = "Passed NULL \'isotree_model\' to \'isotree_serialize_to_file\'.";
  }
  else {
    if (output != (FILE *)0x0) {
      isotree::IsolationForest::serialize((IsolationForest *)isotree_model,output);
      return 0;
    }
    pcVar2 = "Passed invalid file handle to \'isotree_serialize_to_file\'.";
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 1;
}

Assistant:

ISOTREE_EXPORTED
int isotree_serialize_to_file(const void *isotree_model, FILE *output)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_serialize_to_file'." << std::endl;
        return IsoTreeError;
    }
    if (!output) {
        cerr << "Passed invalid file handle to 'isotree_serialize_to_file'." << std::endl;
        return IsoTreeError;
    }

    const IsolationForest *model = (const IsolationForest*)isotree_model;
    
    try
    {
        model->serialize(output);
        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}